

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

void printModel(ModelPtr *model,bool includeMaths)

{
  bool includeMaths_00;
  int iVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  size_t c;
  ulong uVar5;
  ComponentPtr component;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined4 local_44;
  ComponentPtr local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MODEL: \'",8);
  libcellml::NamedEntity::name_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  libcellml::Entity::id_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", id: \'",7);
    libcellml::Entity::id_abi_cxx11_();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  local_44 = (undefined4)CONCAT71(in_register_00000031,includeMaths);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                      FIXED_INDENT_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"UNITS: ",7);
  libcellml::Model::unitsCount();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," custom units",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar3 = libcellml::Model::unitsCount();
  if (lVar3 != 0) {
    uVar5 = 0;
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                          FIXED_INDENT_abi_cxx11_._M_string_length);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                          FIXED_INDENT_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
      uVar5 = uVar5 + 1;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]: ",3);
      libcellml::Model::units((ulong)&local_40);
      libcellml::NamedEntity::name_abi_cxx11_();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_40.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar4 = libcellml::Model::unitsCount();
    } while (uVar5 < uVar4);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                      FIXED_INDENT_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"COMPONENTS: ",0xc);
  libcellml::ComponentEntity::componentCount();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," components",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar3 = libcellml::ComponentEntity::componentCount();
  if (lVar3 != 0) {
    c = 0;
    includeMaths_00 = local_44._0_1_;
    do {
      libcellml::ComponentEntity::component((ulong)&local_40);
      std::operator+(&local_68,&FIXED_INDENT_abi_cxx11_,&FIXED_INDENT_abi_cxx11_);
      printComponent(&local_40,c,&local_68,includeMaths_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_40.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      c = c + 1;
      uVar5 = libcellml::ComponentEntity::componentCount();
    } while (c < uVar5);
  }
  return;
}

Assistant:

void printModel(const libcellml::ModelPtr &model, bool includeMaths)
{
    std::cout << "MODEL: '" << model->name() << "'";
    if (model->id() != "") {
        std::cout << ", id: '" << model->id() << "'";
    }
    std::cout << std::endl;

    std::cout << FIXED_INDENT << "UNITS: " << model->unitsCount() << " custom units" << std::endl;
    for (size_t u = 0; u < model->unitsCount(); ++u) {
        std::cout << FIXED_INDENT << FIXED_INDENT << "[" << u + 1 << "]: " << model->units(u)->name() << std::endl;
    }

    std::cout << FIXED_INDENT << "COMPONENTS: " << model->componentCount() << " components" << std::endl;
    for (size_t c = 0; c < model->componentCount(); ++c) {
        auto component = model->component(c);
        printComponent(component, c, FIXED_INDENT + FIXED_INDENT, includeMaths);
    }
}